

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_double(secp256k1_gej *r,secp256k1_gej *a)

{
  secp256k1_fe *psVar1;
  uint64_t *puVar2;
  uint64_t uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  ulong uVar365;
  uint64_t uVar366;
  uint64_t uVar367;
  ulong uVar368;
  ulong uVar369;
  ulong uVar370;
  ulong uVar371;
  ulong uVar372;
  ulong uVar373;
  ulong uVar374;
  ulong uVar375;
  ulong uVar376;
  ulong uVar377;
  ulong uVar378;
  ulong uVar379;
  ulong uVar380;
  ulong uVar381;
  ulong uVar382;
  ulong uVar383;
  long lVar384;
  ulong uVar385;
  ulong uVar386;
  ulong uVar387;
  long lVar388;
  ulong uVar389;
  ulong uVar390;
  ulong uVar391;
  ulong uVar392;
  uint64_t uVar393;
  uint64_t tmp2;
  secp256k1_fe t1;
  uint64_t tmp3_2;
  uint64_t tmp3_3;
  uint64_t tmp3_4;
  uint64_t tmp3;
  uint64_t tmp3_1;
  
  r->infinity = a->infinity;
  psVar1 = &a->y;
  uVar376 = (a->z).n[0];
  uVar382 = (a->z).n[1];
  uVar383 = (a->z).n[2];
  uVar377 = (a->z).n[3];
  uVar385 = (a->z).n[4];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = psVar1->n[0];
  auVar174._8_8_ = 0;
  auVar174._0_8_ = uVar377;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (a->y).n[1];
  auVar175._8_8_ = 0;
  auVar175._0_8_ = uVar383;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (a->y).n[2];
  auVar176._8_8_ = 0;
  auVar176._0_8_ = uVar382;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (a->y).n[3];
  auVar177._8_8_ = 0;
  auVar177._0_8_ = uVar376;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (a->y).n[4];
  auVar178._8_8_ = 0;
  auVar178._0_8_ = uVar385;
  uVar368 = SUB168(auVar8 * auVar178,0);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar368 & 0xfffffffffffff;
  auVar4 = auVar5 * auVar175 + auVar4 * auVar174 + auVar6 * auVar176 + auVar7 * auVar177 +
           auVar9 * ZEXT816(0x1000003d10);
  uVar374 = auVar4._0_8_;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = uVar374 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = psVar1->n[0];
  auVar179._8_8_ = 0;
  auVar179._0_8_ = uVar385;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = (a->y).n[1];
  auVar180._8_8_ = 0;
  auVar180._0_8_ = uVar377;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (a->y).n[2];
  auVar181._8_8_ = 0;
  auVar181._0_8_ = uVar383;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (a->y).n[3];
  auVar182._8_8_ = 0;
  auVar182._0_8_ = uVar382;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (a->y).n[4];
  auVar183._8_8_ = 0;
  auVar183._0_8_ = uVar376;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar368 >> 0x34 | SUB168(auVar8 * auVar178,8) << 0xc;
  auVar4 = auVar10 * auVar179 + auVar316 + auVar11 * auVar180 + auVar12 * auVar181 +
           auVar13 * auVar182 + auVar14 * auVar183 + auVar15 * ZEXT816(0x1000003d10);
  uVar368 = auVar4._0_8_;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = uVar368 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = psVar1->n[0];
  auVar184._8_8_ = 0;
  auVar184._0_8_ = uVar376;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = (a->y).n[1];
  auVar185._8_8_ = 0;
  auVar185._0_8_ = uVar385;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = (a->y).n[2];
  auVar186._8_8_ = 0;
  auVar186._0_8_ = uVar377;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = (a->y).n[3];
  auVar187._8_8_ = 0;
  auVar187._0_8_ = uVar383;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = (a->y).n[4];
  auVar188._8_8_ = 0;
  auVar188._0_8_ = uVar382;
  auVar4 = auVar17 * auVar185 + auVar317 + auVar18 * auVar186 + auVar19 * auVar187 +
           auVar20 * auVar188;
  uVar375 = auVar4._0_8_;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = uVar375 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = (uVar375 & 0xfffffffffffff) << 4 | (uVar368 & 0xfffffffffffff) >> 0x30;
  auVar4 = auVar16 * auVar184 + ZEXT816(0x1000003d1) * auVar189;
  uVar375 = auVar4._0_8_;
  (r->z).n[0] = uVar375 & 0xfffffffffffff;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = uVar375 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = psVar1->n[0];
  auVar190._8_8_ = 0;
  auVar190._0_8_ = uVar382;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = (a->y).n[1];
  auVar191._8_8_ = 0;
  auVar191._0_8_ = uVar376;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = (a->y).n[2];
  auVar192._8_8_ = 0;
  auVar192._0_8_ = uVar385;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = (a->y).n[3];
  auVar193._8_8_ = 0;
  auVar193._0_8_ = uVar377;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = (a->y).n[4];
  auVar194._8_8_ = 0;
  auVar194._0_8_ = uVar383;
  auVar5 = auVar23 * auVar192 + auVar319 + auVar24 * auVar193 + auVar25 * auVar194;
  uVar375 = auVar5._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar375 & 0xfffffffffffff;
  auVar4 = auVar21 * auVar190 + auVar318 + auVar22 * auVar191 + auVar26 * ZEXT816(0x1000003d10);
  uVar381 = auVar4._0_8_;
  auVar321._8_8_ = 0;
  auVar321._0_8_ = uVar375 >> 0x34 | auVar5._8_8_ << 0xc;
  (r->z).n[1] = uVar381 & 0xfffffffffffff;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = uVar381 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = psVar1->n[0];
  auVar195._8_8_ = 0;
  auVar195._0_8_ = uVar383;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = (a->y).n[1];
  auVar196._8_8_ = 0;
  auVar196._0_8_ = uVar382;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = (a->y).n[2];
  auVar197._8_8_ = 0;
  auVar197._0_8_ = uVar376;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = (a->y).n[3];
  auVar198._8_8_ = 0;
  auVar198._0_8_ = uVar385;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = (a->y).n[4];
  auVar199._8_8_ = 0;
  auVar199._0_8_ = uVar377;
  auVar5 = auVar30 * auVar198 + auVar321 + auVar31 * auVar199;
  uVar376 = auVar5._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar376 & 0xfffffffffffff;
  auVar4 = auVar27 * auVar195 + auVar320 + auVar28 * auVar196 + auVar29 * auVar197 +
           auVar32 * ZEXT816(0x1000003d10);
  uVar382 = auVar4._0_8_;
  (r->z).n[2] = uVar382 & 0xfffffffffffff;
  auVar322._8_8_ = 0;
  auVar322._0_8_ = (uVar382 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar374 & 0xfffffffffffff);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar376 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar322 = auVar33 * ZEXT816(0x1000003d10) + auVar322;
  uVar376 = auVar322._0_8_;
  (r->z).n[3] = uVar376 & 0xfffffffffffff;
  (r->z).n[4] = (uVar376 >> 0x34 | auVar322._8_8_ << 0xc) + (uVar368 & 0xffffffffffff);
  uVar3 = (r->z).n[1];
  uVar393 = (r->z).n[2];
  uVar366 = (r->z).n[3];
  (r->z).n[0] = (r->z).n[0] * 2;
  (r->z).n[1] = uVar3 * 2;
  (r->z).n[2] = uVar393 * 2;
  (r->z).n[3] = uVar366 * 2;
  puVar2 = (r->z).n + 4;
  *puVar2 = *puVar2 << 1;
  uVar376 = (a->x).n[0];
  uVar382 = (a->x).n[1];
  uVar383 = (a->x).n[2];
  uVar377 = (a->x).n[3];
  uVar385 = (a->x).n[4];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar376 * 2;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = uVar377;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar382 * 2;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = uVar383;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar385;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = uVar385;
  uVar368 = SUB168(auVar36 * auVar202,0);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar368 & 0xfffffffffffff;
  auVar4 = auVar35 * auVar201 + auVar34 * auVar200 + auVar37 * ZEXT816(0x1000003d10);
  uVar374 = auVar4._0_8_;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = uVar374 >> 0x34 | auVar4._8_8_ << 0xc;
  uVar385 = uVar385 * 2;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar376;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = uVar385;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar382 * 2;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = uVar377;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar383;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = uVar383;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar368 >> 0x34 | SUB168(auVar36 * auVar202,8) << 0xc;
  auVar4 = auVar38 * auVar203 + auVar323 + auVar39 * auVar204 + auVar40 * auVar205 +
           auVar41 * ZEXT816(0x1000003d10);
  uVar368 = auVar4._0_8_;
  auVar324._8_8_ = 0;
  auVar324._0_8_ = uVar368 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar376;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = uVar376;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar382;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = uVar385;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar383 * 2;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = uVar377;
  auVar4 = auVar43 * auVar207 + auVar324 + auVar44 * auVar208;
  uVar375 = auVar4._0_8_;
  auVar326._8_8_ = 0;
  auVar326._0_8_ = uVar375 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = (uVar375 & 0xfffffffffffff) << 4 | (uVar368 & 0xfffffffffffff) >> 0x30;
  auVar4 = auVar42 * auVar206 + ZEXT816(0x1000003d1) * auVar209;
  uVar375 = auVar4._0_8_;
  uVar369 = uVar375 & 0xfffffffffffff;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = uVar375 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar376 * 2;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = uVar382;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar383;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = uVar385;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar377;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = uVar377;
  auVar5 = auVar46 * auVar211 + auVar326 + auVar47 * auVar212;
  uVar375 = auVar5._0_8_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar375 & 0xfffffffffffff;
  auVar4 = auVar45 * auVar210 + auVar325 + auVar48 * ZEXT816(0x1000003d10);
  uVar381 = auVar4._0_8_;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = uVar375 >> 0x34 | auVar5._8_8_ << 0xc;
  uVar370 = uVar381 & 0xfffffffffffff;
  auVar327._8_8_ = 0;
  auVar327._0_8_ = uVar381 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar376 * 2;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = uVar383;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar382;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = uVar382;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar377;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = uVar385;
  auVar328 = auVar51 * auVar215 + auVar328;
  uVar376 = auVar328._0_8_;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar376 & 0xfffffffffffff;
  auVar4 = auVar49 * auVar213 + auVar327 + auVar50 * auVar214 + auVar52 * ZEXT816(0x1000003d10);
  uVar383 = auVar4._0_8_;
  uVar382 = uVar383 & 0xfffffffffffff;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = (uVar383 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar374 & 0xfffffffffffff);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar376 >> 0x34 | auVar328._8_8_ << 0xc;
  auVar329 = auVar53 * ZEXT816(0x1000003d10) + auVar329;
  uVar376 = auVar329._0_8_;
  lVar384 = (uVar376 >> 0x34 | auVar329._8_8_ << 0xc) + (uVar368 & 0xffffffffffff);
  uVar368 = uVar369 * 3;
  uVar374 = uVar370 * 3;
  uVar375 = uVar382 * 3;
  uVar381 = (uVar376 & 0xfffffffffffff) * 3;
  uVar365 = lVar384 * 3;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar369 * 6;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = uVar381;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar370 * 6;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = uVar375;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar365;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = uVar365;
  uVar383 = SUB168(auVar56 * auVar218,0);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar383 & 0xfffffffffffff;
  auVar4 = auVar55 * auVar217 + auVar54 * auVar216 + auVar57 * ZEXT816(0x1000003d10);
  uVar377 = auVar4._0_8_;
  auVar330._8_8_ = 0;
  auVar330._0_8_ = uVar377 >> 0x34 | auVar4._8_8_ << 0xc;
  uVar376 = lVar384 * 6;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar368;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = uVar376;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar370 * 6;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = uVar381;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar375;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = uVar375;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar383 >> 0x34 | SUB168(auVar56 * auVar218,8) << 0xc;
  auVar4 = auVar58 * auVar219 + auVar330 + auVar59 * auVar220 + auVar60 * auVar221 +
           auVar61 * ZEXT816(0x1000003d10);
  uVar383 = auVar4._0_8_;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = uVar383 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar368;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = uVar368;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar374;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = uVar376;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar382 * 6;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = uVar381;
  auVar4 = auVar63 * auVar223 + auVar331 + auVar64 * auVar224;
  uVar382 = auVar4._0_8_;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = uVar382 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = (uVar382 & 0xfffffffffffff) << 4 | (uVar383 & 0xfffffffffffff) >> 0x30;
  auVar4 = auVar62 * auVar222 + ZEXT816(0x1000003d1) * auVar225;
  uVar382 = auVar4._0_8_;
  uVar370 = uVar382 & 0xfffffffffffff;
  auVar332._8_8_ = 0;
  auVar332._0_8_ = uVar382 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar369 * 6;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = uVar374;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar375;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = uVar376;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar381;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = uVar381;
  auVar5 = auVar66 * auVar227 + auVar333 + auVar67 * auVar228;
  uVar382 = auVar5._0_8_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar382 & 0xfffffffffffff;
  auVar4 = auVar65 * auVar226 + auVar332 + auVar68 * ZEXT816(0x1000003d10);
  uVar385 = auVar4._0_8_;
  auVar335._8_8_ = 0;
  auVar335._0_8_ = uVar382 >> 0x34 | auVar5._8_8_ << 0xc;
  uVar371 = uVar385 & 0xfffffffffffff;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = uVar385 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar369 * 6;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = uVar375;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar374;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = uVar374;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar381;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = uVar376;
  auVar335 = auVar71 * auVar231 + auVar335;
  uVar376 = auVar335._0_8_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar376 & 0xfffffffffffff;
  auVar4 = auVar69 * auVar229 + auVar334 + auVar70 * auVar230 + auVar72 * ZEXT816(0x1000003d10);
  uVar382 = auVar4._0_8_;
  uVar372 = uVar382 & 0xfffffffffffff;
  auVar336._8_8_ = 0;
  auVar336._0_8_ = (uVar382 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar377 & 0xfffffffffffff);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar376 >> 0x34 | auVar335._8_8_ << 0xc;
  auVar336 = auVar73 * ZEXT816(0x1000003d10) + auVar336;
  uVar376 = auVar336._0_8_;
  uVar373 = uVar376 & 0xfffffffffffff;
  lVar384 = (uVar376 >> 0x34 | auVar336._8_8_ << 0xc) + (uVar383 & 0xffffffffffff);
  uVar376 = psVar1->n[0];
  uVar382 = (a->y).n[1];
  uVar383 = (a->y).n[2];
  uVar377 = (a->y).n[3];
  uVar385 = (a->y).n[4];
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar376 * 2;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = uVar377;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar382 * 2;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = uVar383;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar385;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = uVar385;
  uVar369 = SUB168(auVar76 * auVar234,0);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar369 & 0xfffffffffffff;
  auVar4 = auVar75 * auVar233 + auVar74 * auVar232 + auVar77 * ZEXT816(0x1000003d10);
  uVar378 = auVar4._0_8_;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = uVar378 >> 0x34 | auVar4._8_8_ << 0xc;
  uVar385 = uVar385 * 2;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar376;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = uVar385;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar382 * 2;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = uVar377;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar383;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = uVar383;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar369 >> 0x34 | SUB168(auVar76 * auVar234,8) << 0xc;
  auVar4 = auVar78 * auVar235 + auVar337 + auVar79 * auVar236 + auVar80 * auVar237 +
           auVar81 * ZEXT816(0x1000003d10);
  uVar369 = auVar4._0_8_;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = uVar369 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar376;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = uVar376;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar382;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = uVar385;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar383 * 2;
  auVar240._8_8_ = 0;
  auVar240._0_8_ = uVar377;
  auVar4 = auVar83 * auVar239 + auVar338 + auVar84 * auVar240;
  uVar379 = auVar4._0_8_;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = uVar379 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = (uVar379 & 0xfffffffffffff) << 4 | (uVar369 & 0xfffffffffffff) >> 0x30;
  auVar4 = auVar82 * auVar238 + ZEXT816(0x1000003d1) * auVar241;
  uVar386 = auVar4._0_8_;
  uVar379 = uVar386 & 0xfffffffffffff;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = uVar386 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar376 * 2;
  auVar242._8_8_ = 0;
  auVar242._0_8_ = uVar382;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar383;
  auVar243._8_8_ = 0;
  auVar243._0_8_ = uVar385;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar377;
  auVar244._8_8_ = 0;
  auVar244._0_8_ = uVar377;
  auVar5 = auVar86 * auVar243 + auVar340 + auVar87 * auVar244;
  uVar386 = auVar5._0_8_;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar386 & 0xfffffffffffff;
  auVar4 = auVar85 * auVar242 + auVar339 + auVar88 * ZEXT816(0x1000003d10);
  uVar387 = auVar4._0_8_;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = uVar386 >> 0x34 | auVar5._8_8_ << 0xc;
  uVar386 = uVar387 & 0xfffffffffffff;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = uVar387 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar376 * 2;
  auVar245._8_8_ = 0;
  auVar245._0_8_ = uVar383;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar382;
  auVar246._8_8_ = 0;
  auVar246._0_8_ = uVar382;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar377;
  auVar247._8_8_ = 0;
  auVar247._0_8_ = uVar385;
  auVar342 = auVar91 * auVar247 + auVar342;
  uVar376 = auVar342._0_8_;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar376 & 0xfffffffffffff;
  auVar4 = auVar89 * auVar245 + auVar341 + auVar90 * auVar246 + auVar92 * ZEXT816(0x1000003d10);
  uVar382 = auVar4._0_8_;
  uVar387 = uVar382 & 0xfffffffffffff;
  auVar343._8_8_ = 0;
  auVar343._0_8_ = (uVar382 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar378 & 0xfffffffffffff);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar376 >> 0x34 | auVar342._8_8_ << 0xc;
  auVar343 = auVar93 * ZEXT816(0x1000003d10) + auVar343;
  uVar376 = auVar343._0_8_;
  lVar388 = (uVar376 >> 0x34 | auVar343._8_8_ << 0xc) + (uVar369 & 0xffffffffffff);
  uVar383 = uVar379 * 2;
  uVar377 = uVar386 * 2;
  uVar385 = uVar387 * 2;
  uVar369 = (uVar376 & 0xfffffffffffff) * 2;
  uVar376 = lVar388 * 2;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar379 << 2;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = uVar369;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar386 << 2;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = uVar385;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar376;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = uVar376;
  uVar378 = SUB168(auVar96 * auVar250,0);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar378 & 0xfffffffffffff;
  auVar4 = auVar95 * auVar249 + auVar94 * auVar248 + auVar97 * ZEXT816(0x1000003d10);
  uVar380 = auVar4._0_8_;
  auVar344._8_8_ = 0;
  auVar344._0_8_ = uVar380 >> 0x34 | auVar4._8_8_ << 0xc;
  uVar382 = lVar388 * 4;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar383;
  auVar251._8_8_ = 0;
  auVar251._0_8_ = uVar382;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar386 << 2;
  auVar252._8_8_ = 0;
  auVar252._0_8_ = uVar369;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar385;
  auVar253._8_8_ = 0;
  auVar253._0_8_ = uVar385;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar378 >> 0x34 | SUB168(auVar96 * auVar250,8) << 0xc;
  auVar4 = auVar98 * auVar251 + auVar344 + auVar99 * auVar252 + auVar100 * auVar253 +
           auVar101 * ZEXT816(0x1000003d10);
  uVar378 = auVar4._0_8_;
  auVar345._8_8_ = 0;
  auVar345._0_8_ = uVar378 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar383;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = uVar383;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar377;
  auVar255._8_8_ = 0;
  auVar255._0_8_ = uVar382;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar387 << 2;
  auVar256._8_8_ = 0;
  auVar256._0_8_ = uVar369;
  auVar4 = auVar103 * auVar255 + auVar345 + auVar104 * auVar256;
  uVar386 = auVar4._0_8_;
  auVar347._8_8_ = 0;
  auVar347._0_8_ = uVar386 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar257._8_8_ = 0;
  auVar257._0_8_ = (uVar386 & 0xfffffffffffff) << 4 | (uVar378 & 0xfffffffffffff) >> 0x30;
  auVar4 = auVar102 * auVar254 + ZEXT816(0x1000003d1) * auVar257;
  uVar387 = auVar4._0_8_;
  auVar346._8_8_ = 0;
  auVar346._0_8_ = uVar387 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar379 << 2;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = uVar377;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = uVar385;
  auVar259._8_8_ = 0;
  auVar259._0_8_ = uVar382;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar369;
  auVar260._8_8_ = 0;
  auVar260._0_8_ = uVar369;
  auVar5 = auVar106 * auVar259 + auVar347 + auVar107 * auVar260;
  uVar386 = auVar5._0_8_;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = uVar386 & 0xfffffffffffff;
  auVar4 = auVar105 * auVar258 + auVar346 + auVar108 * ZEXT816(0x1000003d10);
  uVar389 = auVar4._0_8_;
  auVar349._8_8_ = 0;
  auVar349._0_8_ = uVar386 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar348._8_8_ = 0;
  auVar348._0_8_ = uVar389 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = uVar379 << 2;
  auVar261._8_8_ = 0;
  auVar261._0_8_ = uVar385;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar377;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = uVar377;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = uVar369;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = uVar382;
  auVar349 = auVar111 * auVar263 + auVar349;
  uVar382 = auVar349._0_8_;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar382 & 0xfffffffffffff;
  auVar4 = auVar109 * auVar261 + auVar348 + auVar110 * auVar262 + auVar112 * ZEXT816(0x1000003d10);
  uVar390 = auVar4._0_8_;
  auVar350._8_8_ = 0;
  auVar350._0_8_ = (uVar390 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar380 & 0xfffffffffffff);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = uVar382 >> 0x34 | auVar349._8_8_ << 0xc;
  auVar350 = auVar113 * ZEXT816(0x1000003d10) + auVar350;
  uVar380 = auVar350._0_8_;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = (a->x).n[0];
  auVar264._8_8_ = 0;
  auVar264._0_8_ = uVar369;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = (a->x).n[1];
  auVar265._8_8_ = 0;
  auVar265._0_8_ = uVar385;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = (a->x).n[2];
  auVar266._8_8_ = 0;
  auVar266._0_8_ = uVar377;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = (a->x).n[3];
  auVar267._8_8_ = 0;
  auVar267._0_8_ = uVar383;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = (a->x).n[4];
  auVar268._8_8_ = 0;
  auVar268._0_8_ = uVar376;
  uVar382 = SUB168(auVar118 * auVar268,0);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = uVar382 & 0xfffffffffffff;
  auVar4 = auVar115 * auVar265 + auVar114 * auVar264 + auVar116 * auVar266 + auVar117 * auVar267 +
           auVar119 * ZEXT816(0x1000003d10);
  uVar379 = auVar4._0_8_;
  auVar351._8_8_ = 0;
  auVar351._0_8_ = uVar379 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = (a->x).n[0];
  auVar269._8_8_ = 0;
  auVar269._0_8_ = uVar376;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = (a->x).n[1];
  auVar270._8_8_ = 0;
  auVar270._0_8_ = uVar369;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = (a->x).n[2];
  auVar271._8_8_ = 0;
  auVar271._0_8_ = uVar385;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = (a->x).n[3];
  auVar272._8_8_ = 0;
  auVar272._0_8_ = uVar377;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = (a->x).n[4];
  auVar273._8_8_ = 0;
  auVar273._0_8_ = uVar383;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = uVar382 >> 0x34 | SUB168(auVar118 * auVar268,8) << 0xc;
  auVar4 = auVar120 * auVar269 + auVar351 + auVar121 * auVar270 + auVar122 * auVar271 +
           auVar123 * auVar272 + auVar124 * auVar273 + auVar125 * ZEXT816(0x1000003d10);
  uVar382 = auVar4._0_8_;
  auVar352._8_8_ = 0;
  auVar352._0_8_ = uVar382 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = (a->x).n[0];
  auVar274._8_8_ = 0;
  auVar274._0_8_ = uVar383;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = (a->x).n[1];
  auVar275._8_8_ = 0;
  auVar275._0_8_ = uVar376;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = (a->x).n[2];
  auVar276._8_8_ = 0;
  auVar276._0_8_ = uVar369;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = (a->x).n[3];
  auVar277._8_8_ = 0;
  auVar277._0_8_ = uVar385;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = (a->x).n[4];
  auVar278._8_8_ = 0;
  auVar278._0_8_ = uVar377;
  auVar4 = auVar127 * auVar275 + auVar352 + auVar128 * auVar276 + auVar129 * auVar277 +
           auVar130 * auVar278;
  uVar386 = auVar4._0_8_;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = uVar386 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = (uVar386 & 0xfffffffffffff) << 4 | (uVar382 & 0xfffffffffffff) >> 0x30;
  auVar4 = auVar126 * auVar274 + ZEXT816(0x1000003d1) * auVar279;
  uVar391 = auVar4._0_8_;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = uVar391 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = (a->x).n[0];
  auVar280._8_8_ = 0;
  auVar280._0_8_ = uVar377;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = (a->x).n[1];
  auVar281._8_8_ = 0;
  auVar281._0_8_ = uVar383;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = (a->x).n[2];
  auVar282._8_8_ = 0;
  auVar282._0_8_ = uVar376;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = (a->x).n[3];
  auVar283._8_8_ = 0;
  auVar283._0_8_ = uVar369;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = (a->x).n[4];
  auVar284._8_8_ = 0;
  auVar284._0_8_ = uVar385;
  auVar5 = auVar133 * auVar282 + auVar354 + auVar134 * auVar283 + auVar135 * auVar284;
  uVar386 = auVar5._0_8_;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uVar386 & 0xfffffffffffff;
  auVar4 = auVar131 * auVar280 + auVar353 + auVar132 * auVar281 + auVar136 * ZEXT816(0x1000003d10);
  uVar392 = auVar4._0_8_;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = uVar386 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar355._8_8_ = 0;
  auVar355._0_8_ = uVar392 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = (a->x).n[0];
  auVar285._8_8_ = 0;
  auVar285._0_8_ = uVar385;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = (a->x).n[1];
  auVar286._8_8_ = 0;
  auVar286._0_8_ = uVar377;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = (a->x).n[2];
  auVar287._8_8_ = 0;
  auVar287._0_8_ = uVar383;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = (a->x).n[3];
  auVar288._8_8_ = 0;
  auVar288._0_8_ = uVar376;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = (a->x).n[4];
  auVar289._8_8_ = 0;
  auVar289._0_8_ = uVar369;
  auVar5 = auVar140 * auVar288 + auVar356 + auVar141 * auVar289;
  uVar376 = auVar5._0_8_;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = uVar376 & 0xfffffffffffff;
  auVar4 = auVar137 * auVar285 + auVar355 + auVar138 * auVar286 + auVar139 * auVar287 +
           auVar142 * ZEXT816(0x1000003d10);
  uVar383 = auVar4._0_8_;
  auVar357._8_8_ = 0;
  auVar357._0_8_ = (uVar383 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar379 & 0xfffffffffffff);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar376 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar357 = auVar143 * ZEXT816(0x1000003d10) + auVar357;
  uVar376 = auVar357._0_8_;
  uVar393 = (uVar376 >> 0x34 | auVar357._8_8_ << 0xc) + (uVar382 & 0xffffffffffff);
  (r->x).n[0] = uVar391 & 0xfffffffffffff;
  (r->x).n[1] = uVar392 & 0xfffffffffffff;
  (r->x).n[4] = uVar393;
  (r->x).n[2] = uVar383 & 0xfffffffffffff;
  (r->x).n[3] = uVar376 & 0xfffffffffffff;
  uVar3 = (r->x).n[1];
  (r->x).n[0] = uVar370 + (r->x).n[0] * -4 + 0x9ffff5ffffd9d6;
  (r->x).n[1] = uVar371 + uVar3 * -4 + 0x9ffffffffffff6;
  uVar3 = (r->x).n[3];
  (r->x).n[2] = uVar372 + (r->x).n[2] * -4 + 0x9ffffffffffff6;
  (r->x).n[3] = uVar373 + uVar3 * -4 + 0x9ffffffffffff6;
  (r->x).n[4] = lVar384 + uVar393 * -4 + 0x9fffffffffff6;
  uVar379 = (uVar391 & 0xffffffff) * 6 + (0x3ffffbfffff0bc - uVar370) +
            (((uVar391 & 0xfffffffffffff) >> 0x20) * 6 << 0x20);
  uVar371 = (uVar392 & 0xffffffff) * 6 + (0x3ffffffffffffc - uVar371) +
            (((uVar392 & 0xfffffffffffff) >> 0x20) * 6 << 0x20);
  uVar369 = (uVar383 & 0xffffffff) * 6 + (0x3ffffffffffffc - uVar372) +
            (((uVar383 & 0xfffffffffffff) >> 0x20) * 6 << 0x20);
  uVar370 = (uVar376 & 0xffffffff) * 6 + (0x3ffffffffffffc - uVar373) +
            (((uVar376 & 0xfffffffffffff) >> 0x20) * 6 << 0x20);
  uVar376 = (0x3fffffffffffc - lVar384) + uVar393 * 6;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar379;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = uVar381;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar371;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = uVar375;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = uVar369;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = uVar374;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = uVar370;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = uVar368;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar376;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = uVar365;
  uVar382 = SUB168(auVar148 * auVar294,0);
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar382 & 0xfffffffffffff;
  auVar4 = auVar145 * auVar291 + auVar144 * auVar290 + auVar146 * auVar292 + auVar147 * auVar293 +
           auVar149 * ZEXT816(0x1000003d10);
  uVar383 = auVar4._0_8_;
  auVar358._8_8_ = 0;
  auVar358._0_8_ = uVar383 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar379;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = uVar365;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uVar371;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = uVar381;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = uVar369;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = uVar375;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = uVar370;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = uVar374;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = uVar376;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = uVar368;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = uVar382 >> 0x34 | SUB168(auVar148 * auVar294,8) << 0xc;
  auVar4 = auVar150 * auVar295 + auVar358 + auVar151 * auVar296 + auVar152 * auVar297 +
           auVar153 * auVar298 + auVar154 * auVar299 + auVar155 * ZEXT816(0x1000003d10);
  uVar382 = auVar4._0_8_;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = uVar382 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = uVar379;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = uVar368;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = uVar371;
  auVar301._8_8_ = 0;
  auVar301._0_8_ = uVar365;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = uVar369;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = uVar381;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = uVar370;
  auVar303._8_8_ = 0;
  auVar303._0_8_ = uVar375;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = uVar376;
  auVar304._8_8_ = 0;
  auVar304._0_8_ = uVar374;
  auVar4 = auVar157 * auVar301 + auVar359 + auVar158 * auVar302 + auVar159 * auVar303 +
           auVar160 * auVar304;
  uVar377 = auVar4._0_8_;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = uVar377 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar305._8_8_ = 0;
  auVar305._0_8_ = (uVar377 & 0xfffffffffffff) << 4 | (uVar382 & 0xfffffffffffff) >> 0x30;
  auVar4 = auVar156 * auVar300 + ZEXT816(0x1000003d1) * auVar305;
  uVar377 = auVar4._0_8_;
  (r->y).n[0] = uVar377 & 0xfffffffffffff;
  auVar360._8_8_ = 0;
  auVar360._0_8_ = uVar377 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = uVar379;
  auVar306._8_8_ = 0;
  auVar306._0_8_ = uVar374;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = uVar371;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = uVar368;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = uVar369;
  auVar308._8_8_ = 0;
  auVar308._0_8_ = uVar365;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = uVar370;
  auVar309._8_8_ = 0;
  auVar309._0_8_ = uVar381;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = uVar376;
  auVar310._8_8_ = 0;
  auVar310._0_8_ = uVar375;
  auVar5 = auVar163 * auVar308 + auVar361 + auVar164 * auVar309 + auVar165 * auVar310;
  uVar377 = auVar5._0_8_;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = uVar377 & 0xfffffffffffff;
  auVar4 = auVar161 * auVar306 + auVar360 + auVar162 * auVar307 + auVar166 * ZEXT816(0x1000003d10);
  uVar385 = auVar4._0_8_;
  auVar363._8_8_ = 0;
  auVar363._0_8_ = uVar377 >> 0x34 | auVar5._8_8_ << 0xc;
  (r->y).n[1] = uVar385 & 0xfffffffffffff;
  auVar362._8_8_ = 0;
  auVar362._0_8_ = uVar385 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = uVar379;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = uVar375;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = uVar371;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = uVar374;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = uVar369;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = uVar368;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = uVar370;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = uVar365;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = uVar376;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = uVar381;
  auVar5 = auVar170 * auVar314 + auVar363 + auVar171 * auVar315;
  uVar376 = auVar5._0_8_;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = uVar376 & 0xfffffffffffff;
  auVar4 = auVar167 * auVar311 + auVar362 + auVar168 * auVar312 + auVar169 * auVar313 +
           auVar172 * ZEXT816(0x1000003d10);
  uVar377 = auVar4._0_8_;
  (r->y).n[2] = uVar377 & 0xfffffffffffff;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = (uVar377 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar383 & 0xfffffffffffff);
  auVar173._8_8_ = 0;
  auVar173._0_8_ = uVar376 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar364 = auVar173 * ZEXT816(0x1000003d10) + auVar364;
  uVar376 = auVar364._0_8_;
  (r->y).n[3] = uVar376 & 0xfffffffffffff;
  (r->y).n[4] = (uVar376 >> 0x34 | auVar364._8_8_ << 0xc) + (uVar382 & 0xffffffffffff);
  uVar393 = (r->y).n[1];
  uVar366 = (r->y).n[2];
  uVar367 = (r->y).n[3];
  uVar3 = (r->y).n[4];
  (r->y).n[0] = (r->y).n[0] + (uVar387 & 0xfffffffffffff) * -2 + 0x5ffff9ffffe91a;
  (r->y).n[1] = uVar393 + (uVar389 & 0xfffffffffffff) * -2 + 0x5ffffffffffffa;
  (r->y).n[2] = uVar366 + (uVar390 & 0xfffffffffffff) * -2 + 0x5ffffffffffffa;
  (r->y).n[3] = uVar367 + (uVar380 & 0xfffffffffffff) * -2 + 0x5ffffffffffffa;
  (r->y).n[4] = uVar3 + ((uVar380 >> 0x34 | auVar350._8_8_ << 0xc) + (uVar378 & 0xffffffffffff)) *
                        -2 + 0x5fffffffffffa;
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_gej_double(secp256k1_gej *r, const secp256k1_gej *a) {
    /* Operations: 3 mul, 4 sqr, 0 normalize, 12 mul_int/add/negate.
     *
     * Note that there is an implementation described at
     *     https://hyperelliptic.org/EFD/g1p/auto-shortw-jacobian-0.html#doubling-dbl-2009-l
     * which trades a multiply for a square, but in practice this is actually slower,
     * mainly because it requires more normalizations.
     */
    secp256k1_fe t1,t2,t3,t4;

    r->infinity = a->infinity;

    secp256k1_fe_mul(&r->z, &a->z, &a->y);
    secp256k1_fe_mul_int(&r->z, 2);       /* Z' = 2*Y*Z (2) */
    secp256k1_fe_sqr(&t1, &a->x);
    secp256k1_fe_mul_int(&t1, 3);         /* T1 = 3*X^2 (3) */
    secp256k1_fe_sqr(&t2, &t1);           /* T2 = 9*X^4 (1) */
    secp256k1_fe_sqr(&t3, &a->y);
    secp256k1_fe_mul_int(&t3, 2);         /* T3 = 2*Y^2 (2) */
    secp256k1_fe_sqr(&t4, &t3);
    secp256k1_fe_mul_int(&t4, 2);         /* T4 = 8*Y^4 (2) */
    secp256k1_fe_mul(&t3, &t3, &a->x);    /* T3 = 2*X*Y^2 (1) */
    r->x = t3;
    secp256k1_fe_mul_int(&r->x, 4);       /* X' = 8*X*Y^2 (4) */
    secp256k1_fe_negate(&r->x, &r->x, 4); /* X' = -8*X*Y^2 (5) */
    secp256k1_fe_add(&r->x, &t2);         /* X' = 9*X^4 - 8*X*Y^2 (6) */
    secp256k1_fe_negate(&t2, &t2, 1);     /* T2 = -9*X^4 (2) */
    secp256k1_fe_mul_int(&t3, 6);         /* T3 = 12*X*Y^2 (6) */
    secp256k1_fe_add(&t3, &t2);           /* T3 = 12*X*Y^2 - 9*X^4 (8) */
    secp256k1_fe_mul(&r->y, &t1, &t3);    /* Y' = 36*X^3*Y^2 - 27*X^6 (1) */
    secp256k1_fe_negate(&t2, &t4, 2);     /* T2 = -8*Y^4 (3) */
    secp256k1_fe_add(&r->y, &t2);         /* Y' = 36*X^3*Y^2 - 27*X^6 - 8*Y^4 (4) */
}